

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

void P_ZMovement(AActor *mo,double oldfloorz)

{
  TObjPtr<AActor> *obj;
  double *pdVar1;
  double oldz;
  uint uVar2;
  player_t *ppVar3;
  extsector_t *peVar4;
  F3DFloor **ppFVar5;
  undefined8 *puVar6;
  DAngle angle;
  bool bVar7;
  int iVar8;
  AActor *pAVar9;
  ASectorAction *pAVar10;
  int iVar11;
  long lVar12;
  undefined4 uVar13;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar14;
  undefined4 extraout_XMM0_Db;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  FName local_34;
  undefined8 local_30;
  
  oldz = (mo->__Pos).Z;
  dVar17 = AActor::GetGravity(mo);
  ppVar3 = mo->player;
  if (((ppVar3 != (player_t *)0x0) && (ppVar3->mo == (APlayerPawn *)mo)) && (oldz < mo->floorz)) {
    dVar16 = ppVar3->viewheight - (mo->floorz - oldz);
    ppVar3->viewheight = dVar16;
    ppVar3->deltaviewheight = ((ppVar3->mo->ViewHeight + ppVar3->crouchviewdelta) - dVar16) * 0.125;
  }
  dVar16 = (mo->Vel).Z;
  dVar15 = mo->floorz;
  dVar19 = oldz + dVar16;
  (mo->__Pos).Z = dVar19;
  if ((dVar19 <= dVar15) || (uVar2 = (mo->flags).Value, (uVar2 >> 9 & 1) != 0)) goto LAB_00428bc1;
  iVar11 = mo->waterlevel;
  if (iVar11 == 0) {
LAB_00428a96:
    dVar18 = dVar16 - (double)(~-(ulong)(dVar19 == oldfloorz) & (ulong)dVar17 |
                              (~-(ulong)(dVar16 == 0.0) & (ulong)dVar17 |
                              (~-(ulong)(dVar15 < oldfloorz) & (ulong)dVar17 |
                              (ulong)(dVar17 + dVar17) & -(ulong)(dVar15 < oldfloorz)) &
                              -(ulong)(dVar16 == 0.0)) & -(ulong)(dVar19 == oldfloorz));
    (mo->Vel).Z = dVar18;
    if (ppVar3 != (player_t *)0x0) goto LAB_00428af4;
LAB_00428b20:
    if (0 < iVar11) {
      if (((uVar2 & 1) == 0) || (((mo->flags3).Value & 0x2000) != 0)) {
        iVar11 = 4000;
        if (mo->Mass < 4000) {
          iVar11 = mo->Mass;
        }
        iVar8 = 1;
        if (1 < iVar11) {
          iVar8 = iVar11;
        }
        dVar17 = ((double)iVar8 * -0.5) / 100.0;
      }
      else {
        dVar17 = 0.0;
        if ((uVar2 >> 0x11 & 1) != 0) {
          dVar17 = -0.0625;
        }
      }
      if (dVar17 <= dVar18) {
        if (dVar17 < dVar18) {
          dVar19 = dVar17 / 3.0;
          if (dVar19 <= -8.0) {
            dVar19 = -8.0;
          }
          dVar19 = dVar16 + dVar19;
          (mo->Vel).Z = dVar19;
          dVar16 = dVar17;
          if (dVar19 < dVar17) goto LAB_00428bb9;
        }
        goto LAB_00428bc1;
      }
      dVar19 = dVar17 + dVar17;
      if (dVar19 <= -8.0) {
        dVar19 = -8.0;
      }
      (mo->Vel).Z = dVar18 - dVar19;
      dVar16 = dVar17;
      if (dVar18 - dVar19 <= dVar17) goto LAB_00428bc1;
      goto LAB_00428bb9;
    }
  }
  else {
    dVar18 = dVar16;
    if (ppVar3 == (player_t *)0x0) goto LAB_00428b20;
    if ((ppVar3->cmd).ucmd.sidemove == 0 && (ppVar3->cmd).ucmd.forwardmove == 0) goto LAB_00428a96;
LAB_00428af4:
    if (1 < iVar11) {
      if (-0.5 <= dVar18) {
        dVar16 = (dVar18 - dVar16) * 0.125 + dVar16;
      }
      else if (-0.5 <= dVar16) {
        dVar16 = -0.5;
      }
LAB_00428bb9:
      (mo->Vel).Z = dVar16;
    }
  }
LAB_00428bc1:
  if (((0.0 < mo->specialf1) && (((mo->flags2).Value & 0x80000) != 0)) &&
     ((ib_compatflags._1_1_ & 1) != 0)) {
    (mo->__Pos).Z = dVar15 + mo->specialf1;
  }
  if ((((mo->flags).Value & 0x4000) != 0) && (((mo->flags2).Value & 0x10000000) == 0)) {
    obj = &mo->target;
    pAVar9 = GC::ReadBarrier<AActor>((AActor **)obj);
    if ((pAVar9 != (AActor *)0x0) && (((mo->flags).Value & 0x1200000) == 0)) {
      pAVar9 = GC::ReadBarrier<AActor>((AActor **)obj);
      dVar16 = AActor::Distance2D(mo,pAVar9,false);
      pAVar9 = GC::ReadBarrier<AActor>((AActor **)obj);
      dVar17 = (mo->__Pos).Z;
      dVar15 = (pAVar9->Height * 0.5 + (pAVar9->__Pos).Z) - dVar17;
      if ((0.0 <= dVar15) || (dVar15 * -3.0 <= dVar16)) {
        if ((dVar15 <= 0.0) || (dVar15 * 3.0 <= dVar16)) goto LAB_00428cfc;
        dVar17 = dVar17 + mo->FloatSpeed;
      }
      else {
        dVar17 = dVar17 - mo->FloatSpeed;
      }
      (mo->__Pos).Z = dVar17;
    }
  }
LAB_00428cfc:
  if (((mo->player != (player_t *)0x0) && (((mo->flags).Value & 0x200) != 0)) &&
     (dVar17 = (mo->__Pos).Z, mo->floorz <= dVar17 && dVar17 != mo->floorz)) {
    bVar7 = AActor::IsNoClip2(mo);
    if (!bVar7) {
      dVar17 = fastsindeg((double)((float)level.maptime * 4.5));
      (mo->__Pos).Z = dVar17 * 0.125 + (mo->__Pos).Z;
    }
    (mo->Vel).Z = (mo->Vel).Z * 0.91796875;
  }
  if ((mo->waterlevel != 0) && (((mo->flags).Value & 0x200) == 0)) {
    peVar4 = mo->Sector->e;
    ppFVar5 = (peVar4->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array;
    uVar2 = (peVar4->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
    for (lVar12 = 0; (ulong)uVar2 << 3 != lVar12; lVar12 = lVar12 + 8) {
      puVar6 = *(undefined8 **)((long)ppFVar5 + lVar12);
      if ((((~*(uint *)(puVar6 + 0xb) & 0x11) == 0) &&
          (dVar17 = (mo->__Pos).Z, dVar16 = secplane_t::ZatPoint((secplane_t *)puVar6[5],mo),
          dVar17 < dVar16)) &&
         (dVar17 = mo->Height, dVar16 = (mo->__Pos).Z,
         dVar15 = secplane_t::ZatPoint((secplane_t *)*puVar6,mo), dVar15 <= dVar17 * 0.5 + dVar16))
      {
        dVar17 = sector_t::GetFriction((sector_t *)puVar6[0xd],*(int *)(puVar6 + 8),(double *)0x0);
        uVar13 = SUB84(dVar17,0);
        uVar14 = (undefined4)((ulong)dVar17 >> 0x20);
        if (0.0 <= dVar17) goto LAB_00428e3c;
        break;
      }
    }
    dVar17 = sector_t::GetFriction(mo->Sector,0,(double *)0x0);
    uVar13 = SUB84(dVar17,0);
    uVar14 = (undefined4)((ulong)dVar17 >> 0x20);
LAB_00428e3c:
    (mo->Vel).Z = (double)CONCAT44(uVar14,uVar13) * (mo->Vel).Z;
  }
  if ((mo->__Pos).Z <= mo->floorz) {
    if (((mo->player == (player_t *)0x0) || ((mo->player->cheats & 0x2000) == 0)) &&
       (pAVar10 = GC::ReadBarrier<ASectorAction>((ASectorAction **)&mo->Sector->SecActTarget),
       pAVar10 != (ASectorAction *)0x0)) {
      dVar17 = secplane_t::ZatPoint(&mo->Sector->floorplane,mo);
      if ((dVar17 == mo->floorz) && (!NAN(dVar17) && !NAN(mo->floorz))) {
        pAVar10 = GC::ReadBarrier<ASectorAction>((ASectorAction **)&mo->Sector->SecActTarget);
        ASectorAction::TriggerAction(pAVar10,mo,4);
      }
    }
    P_CheckFor3DFloorHit(mo,mo->floorz);
    if ((mo->__Pos).Z <= mo->floorz) {
      if (((mo->flags).Value & 0x11000) == 0x10000) {
        (mo->__Pos).Z = mo->floorz;
        if (((mo->BounceFlags).Value & 2) != 0) {
          AActor::FloorBounceMissile(mo,&mo->floorsector->floorplane);
          return;
        }
        uVar2 = (mo->flags3).Value;
        if ((uVar2 >> 0x1c & 1) != 0) {
          P_HitFloor(mo);
          (mo->Vel).Z = 0.0;
          return;
        }
        if ((uVar2 & 1) != 0) {
          return;
        }
        if (((uVar2 >> 0xe & 1) == 0) && ((mo->floorpic).texnum == skyflatnum.texnum)) {
          (*(mo->super_DThinker).super_DObject._vptr_DObject[4])(mo);
          return;
        }
        P_HitFloor(mo);
        P_ExplodeMissile(mo,(line_t_conflict *)0x0,(AActor *)0x0);
        return;
      }
      dVar17 = (mo->Vel).Z;
      uVar13 = SUB84(dVar17,0);
      uVar14 = (undefined4)((ulong)dVar17 >> 0x20);
      if ((((mo->BounceFlags).Value & 0x1000) != 0) && ((dVar17 != 0.0 || (NAN(dVar17))))) {
        AActor::FloorBounceMissile(mo,&mo->floorsector->floorplane);
        dVar17 = (mo->Vel).Z;
        uVar13 = SUB84(dVar17,0);
        uVar14 = (undefined4)((ulong)dVar17 >> 0x20);
      }
      if ((((mo->flags3).Value & 0x2000) != 0) &&
         ((double)CONCAT44(uVar14,uVar13) <= -23.0 && (double)CONCAT44(uVar14,uVar13) != -23.0)) {
        P_MonsterFallingDamage(mo);
        dVar17 = (mo->Vel).Z;
        uVar13 = SUB84(dVar17,0);
        uVar14 = (undefined4)((ulong)dVar17 >> 0x20);
      }
      (mo->__Pos).Z = mo->floorz;
      if ((double)CONCAT44(uVar14,uVar13) <= 0.0 && (double)CONCAT44(uVar14,uVar13) != 0.0) {
        P_HitFloor(mo);
        uVar13 = extraout_XMM0_Da;
        uVar14 = extraout_XMM0_Db;
        if ((mo->DamageType).super_FName.Index == 0x33) {
          uVar13 = 0;
          uVar14 = 0xc0200000;
          pdVar1 = &(mo->Vel).Z;
          if (*pdVar1 <= -8.0 && *pdVar1 != -8.0) {
            mo->tics = 1;
            (mo->Vel).X = 0.0;
            (mo->Vel).Y = 0.0;
            (mo->Vel).Z = 0.0;
            return;
          }
        }
        if (((mo->flags7).Value & 0x4000000) != 0) {
          local_34.Index = 0x9f;
          local_30 = 0;
          angle.Degrees._4_4_ = uVar14;
          angle.Degrees._0_4_ = uVar13;
          P_DamageMobj(mo,(AActor *)0x0,(AActor *)0x0,mo->health,&local_34,0,angle);
        }
        ppVar3 = mo->player;
        if (ppVar3 != (player_t *)0x0) {
          dVar17 = (mo->Vel).Z;
          if ((ppVar3->jumpTics < 0) || (dVar17 < -8.0)) {
            ppVar3->jumpTics = 7;
          }
          if ((dVar17 < -8.0) && (((mo->flags).Value & 0x200) == 0)) {
            PlayerLandedOnThing(mo,(AActor *)0x0);
          }
        }
        (mo->Vel).Z = 0.0;
        uVar13 = 0;
        uVar14 = 0;
      }
      if (((mo->flags).Value & 0x1000000) != 0) {
        (mo->Vel).Z = -(double)CONCAT44(uVar14,uVar13);
      }
      AActor::Crash(mo);
    }
  }
  if (((mo->flags2).Value & 0x20) != 0) {
    AActor::AdjustFloorClip(mo);
  }
  dVar17 = (mo->__Pos).Z + mo->Height;
  if (mo->ceilingz <= dVar17 && dVar17 != mo->ceilingz) {
    if (((mo->player == (player_t *)0x0) || ((mo->player->cheats & 0x2000) == 0)) &&
       (pAVar10 = GC::ReadBarrier<ASectorAction>((ASectorAction **)&mo->Sector->SecActTarget),
       pAVar10 != (ASectorAction *)0x0)) {
      dVar17 = secplane_t::ZatPoint(&mo->Sector->ceilingplane,mo);
      if ((dVar17 == mo->ceilingz) && (!NAN(dVar17) && !NAN(mo->ceilingz))) {
        pAVar10 = GC::ReadBarrier<ASectorAction>((ASectorAction **)&mo->Sector->SecActTarget);
        ASectorAction::TriggerAction(pAVar10,mo,8);
      }
    }
    P_CheckFor3DCeilingHit(mo,mo->ceilingz);
    if (mo->ceilingz < (mo->__Pos).Z + mo->Height) {
      (mo->__Pos).Z = mo->ceilingz - mo->Height;
      if (((mo->BounceFlags).Value & 4) != 0) {
        AActor::FloorBounceMissile(mo,&mo->ceilingsector->ceilingplane);
        return;
      }
      uVar2 = (mo->flags).Value;
      dVar17 = (mo->Vel).Z;
      if ((uVar2 >> 0x18 & 1) != 0) {
        dVar17 = -dVar17;
        (mo->Vel).Z = dVar17;
      }
      if (0.0 < dVar17) {
        (mo->Vel).Z = 0.0;
      }
      if ((uVar2 & 0x11000) == 0x10000) {
        uVar2 = (mo->flags3).Value;
        if ((uVar2 & 2) != 0) {
          return;
        }
        if (((uVar2 >> 0xe & 1) == 0) && ((mo->ceilingpic).texnum == skyflatnum.texnum)) {
          (*(mo->super_DThinker).super_DObject._vptr_DObject[4])(mo);
          return;
        }
        P_ExplodeMissile(mo,(line_t_conflict *)0x0,(AActor *)0x0);
        return;
      }
    }
  }
  P_CheckFakeFloorTriggers(mo,oldz,false);
  return;
}

Assistant:

void P_ZMovement (AActor *mo, double oldfloorz)
{
	double dist;
	double delta;
	double oldz = mo->Z();
	double grav = mo->GetGravity();

//
// check for smooth step up
//
	if (mo->player && mo->player->mo == mo && mo->Z() < mo->floorz)
	{
		mo->player->viewheight -= mo->floorz - mo->Z();
		mo->player->deltaviewheight = mo->player->GetDeltaViewHeight();
	}

	mo->AddZ(mo->Vel.Z);

//
// apply gravity
//
	if (mo->Z() > mo->floorz && !(mo->flags & MF_NOGRAVITY))
	{
		double startvelz = mo->Vel.Z;

		if (mo->waterlevel == 0 || (mo->player &&
			!(mo->player->cmd.ucmd.forwardmove | mo->player->cmd.ucmd.sidemove)))
		{
			// [RH] Double gravity only if running off a ledge. Coming down from
			// an upward thrust (e.g. a jump) should not double it.
			if (mo->Vel.Z == 0 && oldfloorz > mo->floorz && mo->Z() == oldfloorz)
			{
				mo->Vel.Z -= grav + grav;
			}
			else
			{
				mo->Vel.Z -= grav;
			}
		}
		if (mo->player == NULL)
		{
			if (mo->waterlevel >= 1)
			{
				double sinkspeed;

				if ((mo->flags & MF_SPECIAL) && !(mo->flags3 & MF3_ISMONSTER))
				{ // Pickup items don't sink if placed and drop slowly if dropped
					sinkspeed = (mo->flags & MF_DROPPED) ? -WATER_SINK_SPEED / 8 : 0;
				}
				else
				{
					sinkspeed = -WATER_SINK_SPEED;

					// If it's not a player, scale sinkspeed by its mass, with
					// 100 being equivalent to a player.
					if (mo->player == NULL)
					{
						sinkspeed = sinkspeed * clamp(mo->Mass, 1, 4000) / 100;
					}
				}
				if (mo->Vel.Z < sinkspeed)
				{ // Dropping too fast, so slow down toward sinkspeed.
					mo->Vel.Z -= MAX(sinkspeed*2, -8.);
					if (mo->Vel.Z > sinkspeed)
					{
						mo->Vel.Z = sinkspeed;
					}
				}
				else if (mo->Vel.Z > sinkspeed)
				{ // Dropping too slow/going up, so trend toward sinkspeed.
					mo->Vel.Z = startvelz + MAX(sinkspeed/3, -8.);
					if (mo->Vel.Z < sinkspeed)
					{
						mo->Vel.Z = sinkspeed;
					}
				}
			}
		}
		else
		{
			if (mo->waterlevel > 1)
			{
				double sinkspeed = -WATER_SINK_SPEED;

				if (mo->Vel.Z < sinkspeed)
				{
					mo->Vel.Z = (startvelz < sinkspeed) ? startvelz : sinkspeed;
				}
				else
				{
					mo->Vel.Z = startvelz + ((mo->Vel.Z - startvelz) *
						(mo->waterlevel == 1 ? WATER_SINK_SMALL_FACTOR : WATER_SINK_FACTOR));
				}
			}
		}
	}

	// Hexen compatibility handling for floatbobbing. Ugh...
	// Hexen yanked all items to the floor, except those being spawned at map start in the air.
	// Those were kept at their original height.
	// Do this only if the item was actually spawned by the map above ground to avoid problems.
	if (mo->specialf1 > 0 && (mo->flags2 & MF2_FLOATBOB) && (ib_compatflags & BCOMPATF_FLOATBOB))
	{
		mo->SetZ(mo->floorz + mo->specialf1);
	}


//
// adjust height
//
	if ((mo->flags & MF_FLOAT) && !(mo->flags2 & MF2_DORMANT) && mo->target)
	{	// float down towards target if too close
		if (!(mo->flags & (MF_SKULLFLY | MF_INFLOAT)))
		{
			dist = mo->Distance2D (mo->target);
			delta = (mo->target->Center()) - mo->Z();
			if (delta < 0 && dist < -(delta*3))
				mo->AddZ(-mo->FloatSpeed);
			else if (delta > 0 && dist < (delta*3))
				mo->AddZ(mo->FloatSpeed);
		}
	}
	if (mo->player && (mo->flags & MF_NOGRAVITY) && (mo->Z() > mo->floorz))
	{
		if (!mo->IsNoClip2())
		{
			mo->AddZ(DAngle(360 / 80.f * level.maptime).Sin() / 8);
		}
		mo->Vel.Z *= FRICTION_FLY;
	}
	if (mo->waterlevel && !(mo->flags & MF_NOGRAVITY))
	{
		double friction = -1;

		// Check 3D floors -- might be the source of the waterlevel
		for (auto rover : mo->Sector->e->XFloor.ffloors)
		{
			if (!(rover->flags & FF_EXISTS)) continue;
			if (!(rover->flags & FF_SWIMMABLE)) continue;

			if (mo->Z() >= rover->top.plane->ZatPoint(mo) ||
				mo->Center() < rover->bottom.plane->ZatPoint(mo))
				continue;

			friction = rover->model->GetFriction(rover->top.isceiling);
			break;
		}
		if (friction < 0)
			friction = mo->Sector->GetFriction();	// get real friction, even if from a terrain definition

		mo->Vel.Z *= friction;
	}

//
// clip movement
//
	if (mo->Z() <= mo->floorz)
	{	// Hit the floor
		if ((!mo->player || !(mo->player->cheats & CF_PREDICTING)) &&
			mo->Sector->SecActTarget != NULL &&
			mo->Sector->floorplane.ZatPoint(mo) == mo->floorz)
		{ // [RH] Let the sector do something to the actor
			mo->Sector->SecActTarget->TriggerAction (mo, SECSPAC_HitFloor);
		}
		P_CheckFor3DFloorHit(mo, mo->floorz);
		// [RH] Need to recheck this because the sector action might have
		// teleported the actor so it is no longer below the floor.
		if (mo->Z() <= mo->floorz)
		{
			if ((mo->flags & MF_MISSILE) && !(mo->flags & MF_NOCLIP))
			{
				mo->SetZ(mo->floorz);
				if (mo->BounceFlags & BOUNCE_Floors)
				{
					mo->FloorBounceMissile (mo->floorsector->floorplane);
					/* if (!(mo->flags6 & MF6_CANJUMP)) */ return;
				}
				else if (mo->flags3 & MF3_NOEXPLODEFLOOR)
				{
					P_HitFloor (mo);
					mo->Vel.Z = 0;
					return;
				}
				else if (mo->flags3 & MF3_FLOORHUGGER)
				{ // Floor huggers can go up steps
					return;
				}
				else
				{
					if (mo->floorpic == skyflatnum && !(mo->flags3 & MF3_SKYEXPLODE))
					{
						// [RH] Just remove the missile without exploding it
						//		if this is a sky floor.
						mo->Destroy ();
						return;
					}
					P_HitFloor (mo);
					P_ExplodeMissile (mo, NULL, NULL);
					return;
				}
			}
			else if (mo->BounceFlags & BOUNCE_MBF && mo->Vel.Z) // check for MBF-like bounce on non-missiles
			{
				mo->FloorBounceMissile(mo->floorsector->floorplane);
			}
			if (mo->flags3 & MF3_ISMONSTER)		// Blasted mobj falling
			{
				if (mo->Vel.Z < -23)
				{
					P_MonsterFallingDamage (mo);
				}
			}
			mo->SetZ(mo->floorz);
			if (mo->Vel.Z < 0)
			{
				const double minvel = -8;	// landing speed from a jump with normal gravity

				// Spawn splashes, etc.
				P_HitFloor (mo);
				if (mo->DamageType == NAME_Ice && mo->Vel.Z < minvel)
				{
					mo->tics = 1;
					mo->Vel.Zero();
					return;
				}
				// Let the actor do something special for hitting the floor
				if (mo->flags7 & MF7_SMASHABLE)
				{
					P_DamageMobj(mo, nullptr, nullptr, mo->health, NAME_Smash);
				}
				if (mo->player)
				{
					if (mo->player->jumpTics < 0 || mo->Vel.Z < minvel)
					{ // delay any jumping for a short while
						mo->player->jumpTics = 7;
					}
					if (mo->Vel.Z < minvel && !(mo->flags & MF_NOGRAVITY))
					{
						// Squat down.
						// Decrease viewheight for a moment after hitting the ground (hard),
						// and utter appropriate sound.
						PlayerLandedOnThing (mo, NULL);
					}
				}
				mo->Vel.Z = 0;
			}
			if (mo->flags & MF_SKULLFLY)
			{ // The skull slammed into something
				mo->Vel.Z = -mo->Vel.Z;
			}
			mo->Crash();
		}
	}

	if (mo->flags2 & MF2_FLOORCLIP)
	{
		mo->AdjustFloorClip ();
	}

	if (mo->Top() > mo->ceilingz)
	{ // hit the ceiling
		if ((!mo->player || !(mo->player->cheats & CF_PREDICTING)) &&
			mo->Sector->SecActTarget != NULL &&
			mo->Sector->ceilingplane.ZatPoint(mo) == mo->ceilingz)
		{ // [RH] Let the sector do something to the actor
			mo->Sector->SecActTarget->TriggerAction (mo, SECSPAC_HitCeiling);
		}
		P_CheckFor3DCeilingHit(mo, mo->ceilingz);
		// [RH] Need to recheck this because the sector action might have
		// teleported the actor so it is no longer above the ceiling.
		if (mo->Top() > mo->ceilingz)
		{
			mo->SetZ(mo->ceilingz - mo->Height);
			if (mo->BounceFlags & BOUNCE_Ceilings)
			{	// ceiling bounce
				mo->FloorBounceMissile (mo->ceilingsector->ceilingplane);
				/*if (!(mo->flags6 & MF6_CANJUMP))*/ return;
			}
			if (mo->flags & MF_SKULLFLY)
			{	// the skull slammed into something
				mo->Vel.Z = -mo->Vel.Z;
			}
			if (mo->Vel.Z > 0)
				mo->Vel.Z = 0;
			if ((mo->flags & MF_MISSILE) && !(mo->flags & MF_NOCLIP))
			{
				if (mo->flags3 & MF3_CEILINGHUGGER)
				{
					return;
				}
				if (mo->ceilingpic == skyflatnum &&  !(mo->flags3 & MF3_SKYEXPLODE))
				{
					mo->Destroy ();
					return;
				}
				P_ExplodeMissile (mo, NULL, NULL);
				return;
			}
		}
	}
	P_CheckFakeFloorTriggers (mo, oldz);
}